

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.h
# Opt level: O0

bool __thiscall
MinVR::VRDataIndex::exists(VRDataIndex *this,string *key,string *nameSpace,bool inherit)

{
  byte bVar1;
  byte in_CL;
  string *in_RDX;
  bool in_stack_00000137;
  string *in_stack_00000138;
  string *in_stack_00000140;
  VRDataIndex *in_stack_00000148;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  _Self local_68 [3];
  string local_50 [32];
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
  local_28;
  byte local_19;
  
  local_19 = in_CL & 1;
  std::__cxx11::string::string(local_50,in_RDX);
  local_30._M_node =
       (_Base_ptr)_getEntry(in_stack_00000148,in_stack_00000140,in_stack_00000138,in_stack_00000137)
  ;
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
  ::_Rb_tree_const_iterator(&local_28,&local_30);
  local_68[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
              *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  bVar1 = std::operator!=(&local_28,local_68);
  std::__cxx11::string::~string(local_50);
  return (bool)(bVar1 & 1);
}

Assistant:

bool exists(const std::string &key,
              const std::string nameSpace = "",
              const bool inherit = true) const {
	  return const_cast<VRDataIndex*>(this)->_getEntry(key, nameSpace, inherit) != _theIndex.end();
  }